

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailbox.cpp
# Opt level: O0

ssize_t __thiscall zmq::mailbox_t::send(mailbox_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t extraout_RAX;
  ssize_t sVar2;
  void *__buf_00;
  bool ok;
  ypipe_t<zmq::command_t,_16> *in_stack_ffffffffffffffd8;
  
  mutex_t::lock((mutex_t *)this);
  ypipe_t<zmq::command_t,_16>::write(&this->_cpipe,__fd,(void *)0x0,__n);
  bVar1 = ypipe_t<zmq::command_t,_16>::flush(in_stack_ffffffffffffffd8);
  mutex_t::unlock((mutex_t *)this);
  sVar2 = extraout_RAX;
  if (!bVar1) {
    sVar2 = signaler_t::send(&this->_signaler,__fd,__buf_00,__n,__flags);
  }
  return sVar2;
}

Assistant:

void zmq::mailbox_t::send (const command_t &cmd_)
{
    _sync.lock ();
    _cpipe.write (cmd_, false);
    const bool ok = _cpipe.flush ();
    _sync.unlock ();
    if (!ok)
        _signaler.send ();
}